

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O3

void __thiscall
QDirListing::QDirListing
          (QDirListing *this,QString *path,QStringList *nameFilters,IteratorFlags flags)

{
  qsizetype qVar1;
  QArrayData *data;
  char *pcVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  QDirListingPrivate *pQVar6;
  long in_FS_OFFSET;
  QFileSystemEntry local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = (QDirListingPrivate *)operator_new(0x800);
  QDirListingPrivate::QDirListingPrivate(pQVar6);
  this->d = pQVar6;
  QFileSystemEntry::QFileSystemEntry(&local_68,path);
  pQVar6 = this->d;
  pQVar4 = &((pQVar6->initialEntryInfo).entry.m_filePath.d.d)->super_QArrayData;
  pcVar5 = (pQVar6->initialEntryInfo).entry.m_filePath.d.ptr;
  (pQVar6->initialEntryInfo).entry.m_filePath.d.d = local_68.m_filePath.d.d;
  (pQVar6->initialEntryInfo).entry.m_filePath.d.ptr = local_68.m_filePath.d.ptr;
  qVar1 = (pQVar6->initialEntryInfo).entry.m_filePath.d.size;
  (pQVar6->initialEntryInfo).entry.m_filePath.d.size = local_68.m_filePath.d.size;
  data = &((pQVar6->initialEntryInfo).entry.m_nativeFilePath.d.d)->super_QArrayData;
  (pQVar6->initialEntryInfo).entry.m_nativeFilePath.d.d = local_68.m_nativeFilePath.d.d;
  pcVar2 = (pQVar6->initialEntryInfo).entry.m_nativeFilePath.d.ptr;
  (pQVar6->initialEntryInfo).entry.m_nativeFilePath.d.ptr = local_68.m_nativeFilePath.d.ptr;
  qVar3 = (pQVar6->initialEntryInfo).entry.m_nativeFilePath.d.size;
  (pQVar6->initialEntryInfo).entry.m_nativeFilePath.d.size = local_68.m_nativeFilePath.d.size;
  (pQVar6->initialEntryInfo).entry.m_lastDotInFileName = local_68.m_lastDotInFileName;
  (pQVar6->initialEntryInfo).entry.m_lastSeparator = local_68.m_lastSeparator;
  (pQVar6->initialEntryInfo).entry.m_firstDotInFileName = local_68.m_firstDotInFileName;
  local_68.m_filePath.d.d = (Data *)pQVar4;
  local_68.m_filePath.d.ptr = pcVar5;
  local_68.m_filePath.d.size = qVar1;
  local_68.m_nativeFilePath.d.d = (Data *)data;
  local_68.m_nativeFilePath.d.ptr = pcVar2;
  local_68.m_nativeFilePath.d.size = qVar3;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
    }
  }
  if (&(local_68.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_68.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::operator=(&(this->d->nameFilters).d,&nameFilters->d);
  (this->d->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
  super_QFlagsStorage<QDirListing::IteratorFlag>.i =
       (Int)flags.super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
            super_QFlagsStorage<QDirListing::IteratorFlag>.i;
  QDirListingPrivate::init(this->d,(EVP_PKEY_CTX *)0x1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirListing::QDirListing(const QString &path, const QStringList &nameFilters, IteratorFlags flags)
    : d(new QDirListingPrivate)
{
    d->initialEntryInfo.entry = QFileSystemEntry(path);
    d->nameFilters = nameFilters;
    d->iteratorFlags = flags;
    d->init();
}